

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O2

void __thiscall Entity::explode(Entity *this)

{
  float fVar1;
  Explosion *this_00;
  Explosion *local_20;
  
  fVar1 = this->radius;
  this_00 = (Explosion *)operator_new(0x40);
  Explosion::Explosion(this_00,this->x,this->y,32.0 <= fVar1);
  local_20 = this_00;
  std::__cxx11::list<Entity_*,_std::allocator<Entity_*>_>::push_back
            (&new_entities_abi_cxx11_,(value_type *)&local_20);
  my_play_sample((uint)(fVar1 < 32.0) * 4 + 0x1b);
  return;
}

Assistant:

void Entity::explode(void)
{
   bool big;
   if (radius >= 32)
      big = true;
   else
      big = false;
   Explosion *e = new Explosion(x, y, big);
   new_entities.push_back(e);
   if (big)
      my_play_sample(RES_BIGEXPLOSION);
   else
      my_play_sample(RES_SMALLEXPLOSION);
}